

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

bool re2::RE2::ConsumeN(StringPiece *input,RE2 *re,Arg **args,int n)

{
  bool bVar1;
  int consumed;
  int local_c;
  
  bVar1 = DoMatch(re,input,ANCHOR_START,&local_c,args,n);
  if (bVar1) {
    input->ptr_ = input->ptr_ + local_c;
    input->length_ = input->length_ - local_c;
  }
  return bVar1;
}

Assistant:

bool RE2::ConsumeN(StringPiece* input, const RE2& re,
                   const Arg* const args[], int n) {
  int consumed;
  if (re.DoMatch(*input, ANCHOR_START, &consumed, args, n)) {
    input->remove_prefix(consumed);
    return true;
  } else {
    return false;
  }
}